

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::DataToString_abi_cxx11_
          (string *__return_storage_ptr__,CopyTest *this,GLuint count,GLubyte *data)

{
  long lVar1;
  string local_1d8 [32];
  stringstream int_sstream;
  undefined1 local_1a8 [376];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)&int_sstream);
  for (lVar1 = 1; lVar1 - (ulong)count != 1; lVar1 = lVar1 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&int_sstream);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::stringstream::~stringstream((stringstream *)&int_sstream);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CopyTest::DataToString(glw::GLuint count, const glw::GLubyte data[])
{
	std::string data_str = "[";

	for (glw::GLuint i = 0; i < count; ++i)
	{
		std::stringstream int_sstream;

		int_sstream << unsigned(data[i]);

		data_str.append(int_sstream.str());

		if (i + 1 < count)
		{
			data_str.append(", ");
		}
		else
		{
			data_str.append("]");
		}
	}

	return data_str;
}